

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

HashErr insert_symbol(SymbolTable *s,char *name,SymbolInfo val)

{
  char cVar1;
  Bucket *pBVar2;
  int iVar3;
  int iVar4;
  Bucket *pBStack_40;
  char firstc;
  Bucket *b;
  Symbol *sym;
  int bucket_num;
  int i;
  char *name_local;
  SymbolTable *s_local;
  SymbolInfo val_local;
  
  iVar3 = hash_code(name);
  cVar1 = *name;
  pBStack_40 = s->bucket[iVar3];
  sym._4_4_ = pBStack_40->num_symbols;
  pBVar2 = pBStack_40;
  while( true ) {
    b = (Bucket *)pBVar2->symbol;
    if (sym._4_4_ < 1) {
      if (pBStack_40->max_symbols <= pBStack_40->num_symbols) {
        pBStack_40->max_symbols = pBStack_40->max_symbols << 1;
        pBStack_40 = (Bucket *)
                     realloc(pBStack_40,(long)(pBStack_40->max_symbols + -7) * 0x10 + 0x78);
        s->bucket[iVar3] = pBStack_40;
      }
      iVar3 = pBStack_40->num_symbols;
      pBStack_40->num_symbols = iVar3 + 1;
      pBStack_40->symbol[iVar3].name = name;
      pBStack_40->symbol[iVar3].value = val;
      return HASH_NOERR;
    }
    if ((cVar1 == **(char **)b) && (iVar4 = strcmp(name,*(char **)b), iVar4 == 0)) break;
    pBVar2 = (Bucket *)b->symbol;
    sym._4_4_ = sym._4_4_ + -1;
  }
  return HASH_DUPLICATE;
}

Assistant:

HashErr
insert_symbol (SymbolTable *s, const char *name, SymbolInfo val)
{
  int i, bucket_num = hash_code (name);
  Symbol *sym;
  Bucket *b;
  char firstc = *name;

  b = s->bucket[bucket_num];
  
  /* First, check for a duplicate. */
  for (i = b->num_symbols, sym = &b->symbol[0]; i > 0; sym++, i--)
    if (firstc == sym->name[0] && !strcmp (name, sym->name))
      return HASH_DUPLICATE;

  /* If there isn't room, double the size of the bucket. */
  if (b->num_symbols >= b->max_symbols)
    {
      b->max_symbols *= 2;
      b = s->bucket[bucket_num] =
	(Bucket *) realloc (b, sizeof *b + ((b->max_symbols - INITIAL_SYMBOLS)
					    * sizeof (Symbol)));
    }

  sym = &b->symbol[b->num_symbols++];
  sym->name = name;
  sym->value = val;

  return HASH_NOERR;
}